

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::CollectUnmarkedBlock(Range *curr)

{
  ulong *puVar1;
  markerType *marker;
  void *block;
  Range *curr_local;
  
  puVar1 = (ulong *)((long)curr->start + 4);
  if ((*puVar1 & OBJECT_VISIBLE) == 0) {
    if (((*puVar1 & OBJECT_FINALIZABLE) == 0) || ((*puVar1 & OBJECT_FINALIZED) != 0)) {
      FastVector<NULLC::Range,_false,_false>::push_back
                ((FastVector<NULLC::Range,_false,_false> *)blocksToFree,curr);
    }
    else {
      FastVector<NULLC::Range,_false,_false>::push_back
                ((FastVector<NULLC::Range,_false,_false> *)blocksToFinalize,curr);
    }
  }
  return;
}

Assistant:

void NULLC::CollectUnmarkedBlock(Range& curr)
{
	void *block = curr.start;

	markerType &marker = *(markerType*)((char*)block + 4);

	if(!(marker & NULLC::OBJECT_VISIBLE))
	{
		if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
		{
			blocksToFinalize.push_back(curr);
		}
		else
		{
			blocksToFree.push_back(curr);
		}
	}
}